

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

ConditionalDirectiveExpressionSyntax * __thiscall
slang::parsing::Preprocessor::parseConditionalExpr(Preprocessor *this)

{
  Token *pTVar1;
  undefined8 uVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  uint uVar8;
  ConditionalDirectiveExpressionSyntax *pCVar9;
  ParenthesizedConditionalDirectiveExpressionSyntax *pPVar10;
  Token TVar11;
  Token openParen;
  Token op;
  Token closeParen;
  Token local_68;
  Token *local_58;
  Token local_50;
  Token local_40;
  
  if ((this->currentToken).info == (Info *)0x0) {
    TVar11 = nextProcessed(this);
    this->currentToken = TVar11;
  }
  pTVar1 = &this->currentToken;
  if ((this->currentToken).kind == Exclamation) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar11 = nextProcessed(this);
      this->currentToken = TVar11;
    }
    uVar2._0_2_ = (this->currentToken).kind;
    uVar2._2_1_ = (this->currentToken).field_0x2;
    uVar2._3_1_ = (this->currentToken).numFlags.raw;
    uVar2._4_4_ = (this->currentToken).rawLen;
    pIVar3 = (this->currentToken).info;
    uVar5 = pTVar1->field_0x2;
    NVar6.raw = (pTVar1->numFlags).raw;
    uVar7 = pTVar1->rawLen;
    pIVar4 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar5;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar6.raw;
    (this->lastConsumed).rawLen = uVar7;
    (this->lastConsumed).info = pIVar4;
    Token::Token(&local_68);
    TVar11 = local_68;
    pTVar1->kind = local_68.kind;
    pTVar1->field_0x2 = local_68._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_68.numFlags.raw;
    pTVar1->rawLen = local_68.rawLen;
    (this->currentToken).info = local_68.info;
    local_68 = TVar11;
    local_50._0_8_ = uVar2;
    local_50.info = pIVar3;
    if ((this->currentToken).info == (Info *)0x0) {
      TVar11 = nextProcessed(this);
      this->currentToken = TVar11;
    }
    if (pTVar1->kind == OpenParenthesis) {
      if ((this->currentToken).info == (Info *)0x0) {
        TVar11 = nextProcessed(this);
        this->currentToken = TVar11;
      }
      TVar11 = this->currentToken;
      uVar5 = pTVar1->field_0x2;
      NVar6.raw = (pTVar1->numFlags).raw;
      uVar7 = pTVar1->rawLen;
      pIVar3 = (this->currentToken).info;
      (this->lastConsumed).kind = pTVar1->kind;
      (this->lastConsumed).field_0x2 = uVar5;
      (this->lastConsumed).numFlags = (NumericTokenFlags)NVar6.raw;
      (this->lastConsumed).rawLen = uVar7;
      (this->lastConsumed).info = pIVar3;
      Token::Token(&local_68);
      pTVar1->kind = local_68.kind;
      pTVar1->field_0x2 = local_68._2_1_;
      pTVar1->numFlags = (NumericTokenFlags)local_68.numFlags.raw;
      pTVar1->rawLen = local_68.rawLen;
      (this->currentToken).info = local_68.info;
      local_68 = TVar11;
      pCVar9 = parseConditionalExpr(this);
      local_40 = expect(this,CloseParenthesis);
      pPVar10 = BumpAllocator::
                emplace<slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&>
                          (this->alloc,&local_68,pCVar9,&local_40);
    }
    else {
      local_68 = expect(this,Identifier);
      pPVar10 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
                BumpAllocator::
                emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token&>
                          (this->alloc,&local_68);
    }
    pPVar10 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
              BumpAllocator::
              emplace<slang::syntax::UnaryConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                        (this->alloc,&local_50,&pPVar10->super_ConditionalDirectiveExpressionSyntax)
    ;
  }
  else {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar11 = nextProcessed(this);
      this->currentToken = TVar11;
    }
    if (pTVar1->kind == OpenParenthesis) {
      if ((this->currentToken).info == (Info *)0x0) {
        TVar11 = nextProcessed(this);
        this->currentToken = TVar11;
      }
      TVar11 = this->currentToken;
      uVar5 = pTVar1->field_0x2;
      NVar6.raw = (pTVar1->numFlags).raw;
      uVar7 = pTVar1->rawLen;
      pIVar3 = (this->currentToken).info;
      (this->lastConsumed).kind = pTVar1->kind;
      (this->lastConsumed).field_0x2 = uVar5;
      (this->lastConsumed).numFlags = (NumericTokenFlags)NVar6.raw;
      (this->lastConsumed).rawLen = uVar7;
      (this->lastConsumed).info = pIVar3;
      Token::Token(&local_68);
      pTVar1->kind = local_68.kind;
      pTVar1->field_0x2 = local_68._2_1_;
      pTVar1->numFlags = (NumericTokenFlags)local_68.numFlags.raw;
      pTVar1->rawLen = local_68.rawLen;
      (this->currentToken).info = local_68.info;
      local_68 = TVar11;
      pCVar9 = parseConditionalExpr(this);
      local_40 = expect(this,CloseParenthesis);
      pPVar10 = BumpAllocator::
                emplace<slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&>
                          (this->alloc,&local_68,pCVar9,&local_40);
    }
    else {
      local_68 = expect(this,Identifier);
      pPVar10 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
                BumpAllocator::
                emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token&>
                          (this->alloc,&local_68);
    }
  }
  local_58 = &this->lastConsumed;
  while( true ) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar11 = nextProcessed(this);
      this->currentToken = TVar11;
    }
    uVar8 = pTVar1->kind - 0x26;
    if ((0x34 < uVar8) || ((0x10440000000001U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) break;
    if ((this->currentToken).info == (Info *)0x0) {
      TVar11 = nextProcessed(this);
      this->currentToken = TVar11;
    }
    TVar11 = this->currentToken;
    uVar5 = pTVar1->field_0x2;
    NVar6.raw = (pTVar1->numFlags).raw;
    uVar7 = pTVar1->rawLen;
    pIVar3 = (this->currentToken).info;
    local_58->kind = pTVar1->kind;
    local_58->field_0x2 = uVar5;
    local_58->numFlags = (NumericTokenFlags)NVar6.raw;
    local_58->rawLen = uVar7;
    local_58->info = pIVar3;
    Token::Token(&local_68);
    pTVar1->kind = local_68.kind;
    pTVar1->field_0x2 = local_68._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_68.numFlags.raw;
    pTVar1->rawLen = local_68.rawLen;
    (this->currentToken).info = local_68.info;
    local_68 = TVar11;
    pCVar9 = parseConditionalExpr(this);
    pPVar10 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
              BumpAllocator::
              emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                        (this->alloc,&pPVar10->super_ConditionalDirectiveExpressionSyntax,&local_68,
                         pCVar9);
  }
  return &pPVar10->super_ConditionalDirectiveExpressionSyntax;
}

Assistant:

ConditionalDirectiveExpressionSyntax* Preprocessor::parseConditionalExpr() {
    auto isBinaryOp = [](TokenKind kind) {
        switch (kind) {
            case TokenKind::DoubleAnd:
            case TokenKind::DoubleOr:
            case TokenKind::MinusArrow:
            case TokenKind::LessThanMinusArrow:
                return true;
            default:
                return false;
        }
    };

    auto parsePrimary = [&]() -> ConditionalDirectiveExpressionSyntax* {
        Token token = peek();
        if (token.kind == TokenKind::OpenParenthesis) {
            auto openParen = consume();
            auto operand = parseConditionalExpr();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            return alloc.emplace<ParenthesizedConditionalDirectiveExpressionSyntax>(openParen,
                                                                                    *operand,
                                                                                    closeParen);
        }
        else {
            auto id = expect(TokenKind::Identifier);
            return alloc.emplace<NamedConditionalDirectiveExpressionSyntax>(id);
        }
    };

    ConditionalDirectiveExpressionSyntax* left;
    if (peek(TokenKind::Exclamation)) {
        auto op = consume();
        auto operand = parsePrimary();
        left = alloc.emplace<UnaryConditionalDirectiveExpressionSyntax>(op, *operand);
    }
    else {
        left = parsePrimary();
    }

    while (true) {
        if (!isBinaryOp(peek().kind))
            break;

        auto op = consume();
        auto right = parseConditionalExpr();
        left = alloc.emplace<BinaryConditionalDirectiveExpressionSyntax>(*left, op, *right);
    }

    return left;
}